

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# certificate_policies_unittest.cc
# Opt level: O3

void __thiscall
bssl::anon_unknown_0::
ParseCertificatePoliciesExtensionOidsTest_InvalidAnyPolicyWithCustomQualifier_Test::
~ParseCertificatePoliciesExtensionOidsTest_InvalidAnyPolicyWithCustomQualifier_Test
          (ParseCertificatePoliciesExtensionOidsTest_InvalidAnyPolicyWithCustomQualifier_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x18);
  return;
}

Assistant:

TEST_P(ParseCertificatePoliciesExtensionOidsTest,
       InvalidAnyPolicyWithCustomQualifier) {
  std::string der;
  ASSERT_TRUE(
      LoadTestData("invalid-anypolicy_with_custom_qualifier.pem", &der));
  std::vector<der::Input> policies;
  CertErrors errors;
  EXPECT_FALSE(ParseCertificatePoliciesExtensionOids(
      StringAsBytes(der), fail_parsing_unknown_qualifier_oids(), &policies,
      &errors));
}